

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O2

float ComputeDistanceAttenuation(float normalizedDistance,F3DAUDIO_DISTANCE_CURVE *pCurve)

{
  F3DAUDIO_DISTANCE_CURVE_POINT *pFVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  if (pCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
    fVar5 = 1.0;
    if (1.0 <= normalizedDistance) {
      fVar5 = 1.0 / normalizedDistance;
    }
  }
  else {
    pFVar1 = pCurve->pPoints;
    uVar3 = (ulong)pCurve->PointCount;
    for (uVar4 = 1;
        (uVar2 = uVar3 + (uVar3 == 0), uVar4 < uVar3 &&
        (uVar2 = uVar4, pFVar1[uVar4].Distance <= normalizedDistance)); uVar4 = uVar4 + 1) {
    }
    if (uVar2 != uVar3) {
      fVar5 = (pFVar1[uVar2].Distance - normalizedDistance) /
              (pFVar1[uVar2].Distance - pFVar1[uVar2 - 1].Distance);
      return (1.0 - fVar5) * pFVar1[uVar2].DSPSetting + fVar5 * pFVar1[uVar2 - 1].DSPSetting;
    }
    fVar5 = pFVar1[pCurve->PointCount - 1].DSPSetting;
  }
  return fVar5;
}

Assistant:

static inline float ComputeDistanceAttenuation(
	float normalizedDistance,
	F3DAUDIO_DISTANCE_CURVE *pCurve
) {
	float res;
	float alpha;
	uint32_t n_points;
	size_t i;
	if (pCurve)
	{
		F3DAUDIO_DISTANCE_CURVE_POINT* points = pCurve->pPoints;
		n_points = pCurve->PointCount;

		/* By definition, the first point in the curve must be 0.0f
		 * -Adrien
		 */

		/* We advance i up until our normalizedDistance lies between the distances of
		 * the i_th and (i-1)_th points, or we reach the last point.
		 */
		for (i = 1; (i < n_points) && (normalizedDistance >= points[i].Distance); i += 1);
		if (i == n_points)
		{
			/* We've reached the last point, so we use its value directly.
			 * Quote X3DAUDIO docs:
			 * "If an emitter moves beyond a distance of (CurveDistanceScaler × 1.0f),
			 * the last point on the curve is used to compute the volume output level."
			 */
			res = points[n_points - 1].DSPSetting;
		}
		else
		{
			/* We're between two points: the distance attenuation is the linear interpolation of the DSPSetting
			 * values defined by our points, according to the distance.
			 */
			alpha = (points[i].Distance - normalizedDistance) / (points[i].Distance - points[i - 1].Distance);
			res = LERP(alpha, points[i].DSPSetting, points[i - 1].DSPSetting);
		}
	}
	else
	{
		res = 1.0f;
		if (normalizedDistance >= 1.0f)
		{
			res /= normalizedDistance;
		}
	}
	return res;
}